

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosStream.cpp
# Opt level: O1

void __thiscall
adiosStream::adiosStream
          (adiosStream *this,string *streamName,IO *io,Mode mode,MPI_Comm comm,bool iotimer,
          size_t appid)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  uint uVar3;
  char cVar4;
  uint uVar5;
  Engine *pEVar6;
  undefined8 *puVar7;
  long *plVar8;
  FILE *__stream;
  ulong uVar9;
  undefined8 *puVar10;
  size_type *psVar11;
  ulong uVar12;
  ulong *puVar13;
  uint __len;
  char cVar14;
  undefined8 uVar15;
  ulong uVar16;
  double dVar17;
  int totalRanks;
  adiosStream *local_168;
  int myRank;
  undefined8 *local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  Engine *local_138;
  string __str;
  undefined8 *local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  string logfilename;
  string __str_2;
  double local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  ulong *local_88;
  long local_80;
  ulong local_78;
  long lStack_70;
  string __str_1;
  vector<double,_std::allocator<double>_> opentime_all_ranks;
  
  Stream::Stream(&this->super_Stream,streamName,mode);
  (this->super_Stream)._vptr_Stream = (_func_int **)&PTR__adiosStream_00125cb0;
  (this->engine).m_Engine = (Engine *)0x0;
  (this->io).m_IO = io->m_IO;
  this->comm = comm;
  local_168 = this;
  MPI_Comm_rank(comm,&myRank);
  MPI_Comm_size(comm,&totalRanks);
  local_138 = &local_168->engine;
  local_168->hasIOTimer = iotimer;
  local_168->appID = appid;
  if (mode == Write) {
    local_b0 = (double)MPI_Wtime();
    pEVar6 = (Engine *)adios2::IO::Open((string *)io,(Mode)streamName,(ompi_communicator_t *)0x1);
    local_138->m_Engine = pEVar6;
    dVar17 = (double)MPI_Wtime();
  }
  else {
    local_b0 = (double)MPI_Wtime();
    pEVar6 = (Engine *)adios2::IO::Open((string *)io,(Mode)streamName,(ompi_communicator_t *)0x2);
    local_138->m_Engine = pEVar6;
    dVar17 = (double)MPI_Wtime();
  }
  if (local_168->hasIOTimer == true) {
    local_168->openTime = dVar17 - local_b0;
    opentime_all_ranks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    opentime_all_ranks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    opentime_all_ranks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (myRank == 0) {
      uVar16 = local_168->appID;
      cVar14 = '\x01';
      if (9 < uVar16) {
        uVar9 = uVar16;
        cVar4 = '\x04';
        do {
          cVar14 = cVar4;
          if (uVar9 < 100) {
            cVar14 = cVar14 + -2;
            goto LAB_00115706;
          }
          if (uVar9 < 1000) {
            cVar14 = cVar14 + -1;
            goto LAB_00115706;
          }
          if (uVar9 < 10000) goto LAB_00115706;
          bVar2 = 99999 < uVar9;
          uVar9 = uVar9 / 10000;
          cVar4 = cVar14 + '\x04';
        } while (bVar2);
        cVar14 = cVar14 + '\x01';
      }
LAB_00115706:
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      std::__cxx11::string::_M_construct((ulong)&__str,cVar14);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar16);
      puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x11d184);
      puVar10 = puVar7 + 2;
      if ((undefined8 *)*puVar7 == puVar10) {
        local_148 = *puVar10;
        uStack_140 = puVar7[3];
        local_158 = &local_148;
      }
      else {
        local_148 = *puVar10;
        local_158 = (undefined8 *)*puVar7;
      }
      local_150 = puVar7[1];
      *puVar7 = puVar10;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_158);
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar11) {
        logfilename.field_2._M_allocated_capacity = *psVar11;
        logfilename.field_2._8_8_ = plVar8[3];
        logfilename._M_dataplus._M_p = (pointer)&logfilename.field_2;
      }
      else {
        logfilename.field_2._M_allocated_capacity = *psVar11;
        logfilename._M_dataplus._M_p = (pointer)*plVar8;
      }
      logfilename._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if (local_158 != &local_148) {
        operator_delete(local_158);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p);
      }
      __stream = fopen(logfilename._M_dataplus._M_p,"w");
      local_168->perfLogFP = (FILE *)__stream;
      fputs("step,rank,operation,time\n",__stream);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"performance log file open succeeded!",0x24);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
      std::ostream::put('H');
      std::ostream::flush();
      std::vector<double,_std::allocator<double>_>::reserve(&opentime_all_ranks,(long)totalRanks);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)logfilename._M_dataplus._M_p != &logfilename.field_2) {
        operator_delete(logfilename._M_dataplus._M_p);
      }
    }
    MPI_Gather(&local_168->openTime,1,&ompi_mpi_double,
               opentime_all_ranks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,1,&ompi_mpi_double,0,comm);
    if ((myRank == 0) && (0 < totalRanks)) {
      paVar1 = &__str.field_2;
      uVar16 = 0;
      do {
        uVar9 = adios2::Engine::CurrentStep();
        cVar14 = '\x01';
        if (9 < uVar9) {
          uVar12 = uVar9;
          cVar4 = '\x04';
          do {
            cVar14 = cVar4;
            if (uVar12 < 100) {
              cVar14 = cVar14 + -2;
              goto LAB_00115972;
            }
            if (uVar12 < 1000) {
              cVar14 = cVar14 + -1;
              goto LAB_00115972;
            }
            if (uVar12 < 10000) goto LAB_00115972;
            bVar2 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar4 = cVar14 + '\x04';
          } while (bVar2);
          cVar14 = cVar14 + '\x01';
        }
LAB_00115972:
        __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
        std::__cxx11::string::_M_construct((ulong)&__str_1,cVar14);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (__str_1._M_dataplus._M_p,(uint)__str_1._M_string_length,uVar9);
        plVar8 = (long *)std::__cxx11::string::append((char *)&__str_1);
        puVar13 = (ulong *)(plVar8 + 2);
        if ((ulong *)*plVar8 == puVar13) {
          local_78 = *puVar13;
          lStack_70 = plVar8[3];
          local_88 = &local_78;
        }
        else {
          local_78 = *puVar13;
          local_88 = (ulong *)*plVar8;
        }
        local_80 = plVar8[1];
        *plVar8 = (long)puVar13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        __len = 1;
        if (9 < uVar16) {
          uVar3 = 4;
          uVar9 = uVar16;
          do {
            __len = uVar3;
            uVar5 = (uint)uVar9;
            if (uVar5 < 100) {
              __len = __len - 2;
              goto LAB_00115a57;
            }
            if (uVar5 < 1000) {
              __len = __len - 1;
              goto LAB_00115a57;
            }
            if (uVar5 < 10000) goto LAB_00115a57;
            uVar9 = (uVar9 & 0xffffffff) / 10000;
            uVar3 = __len + 4;
          } while (99999 < uVar5);
          __len = __len + 1;
        }
LAB_00115a57:
        __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
        std::__cxx11::string::_M_construct((ulong)&__str_2,(char)__len);
        std::__detail::__to_chars_10_impl<unsigned_int>(__str_2._M_dataplus._M_p,__len,(uint)uVar16)
        ;
        uVar9 = 0xf;
        if (local_88 != &local_78) {
          uVar9 = local_78;
        }
        if (uVar9 < __str_2._M_string_length + local_80) {
          uVar15 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
            uVar15 = __str_2.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar15 < __str_2._M_string_length + local_80) goto LAB_00115ae4;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&__str_2,0,(char *)0x0,(ulong)local_88);
        }
        else {
LAB_00115ae4:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_88,(ulong)__str_2._M_dataplus._M_p);
        }
        local_110 = &local_100;
        puVar10 = puVar7 + 2;
        if ((undefined8 *)*puVar7 == puVar10) {
          local_100 = *puVar10;
          uStack_f8 = puVar7[3];
        }
        else {
          local_100 = *puVar10;
          local_110 = (undefined8 *)*puVar7;
        }
        local_108 = puVar7[1];
        *puVar7 = puVar10;
        puVar7[1] = 0;
        *(undefined1 *)puVar10 = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_110);
        psVar11 = (size_type *)(plVar8 + 2);
        if ((size_type *)*plVar8 == psVar11) {
          __str.field_2._M_allocated_capacity = *psVar11;
          __str.field_2._8_8_ = plVar8[3];
          __str._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          __str.field_2._M_allocated_capacity = *psVar11;
          __str._M_dataplus._M_p = (pointer)*plVar8;
        }
        __str._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                  (&local_a8,vsnprintf,0x148,"%f",
                   opentime_all_ranks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar16]);
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != paVar1) {
          uVar15 = __str.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar15 < local_a8._M_string_length + __str._M_string_length) {
          uVar15 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            uVar15 = local_a8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar15 < local_a8._M_string_length + __str._M_string_length) goto LAB_00115c2a;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_a8,0,(char *)0x0,(ulong)__str._M_dataplus._M_p);
        }
        else {
LAB_00115c2a:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&__str,(ulong)local_a8._M_dataplus._M_p);
        }
        local_158 = &local_148;
        puVar10 = puVar7 + 2;
        if ((undefined8 *)*puVar7 == puVar10) {
          local_148 = *puVar10;
          uStack_140 = puVar7[3];
        }
        else {
          local_148 = *puVar10;
          local_158 = (undefined8 *)*puVar7;
        }
        local_150 = puVar7[1];
        *puVar7 = puVar10;
        puVar7[1] = 0;
        *(undefined1 *)puVar10 = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_158);
        logfilename._M_dataplus._M_p = (pointer)&logfilename.field_2;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((size_type *)*plVar8 == psVar11) {
          logfilename.field_2._M_allocated_capacity = *psVar11;
          logfilename.field_2._8_8_ = plVar8[3];
        }
        else {
          logfilename.field_2._M_allocated_capacity = *psVar11;
          logfilename._M_dataplus._M_p = (pointer)*plVar8;
        }
        logfilename._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if (local_158 != &local_148) {
          operator_delete(local_158);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != paVar1) {
          operator_delete(__str._M_dataplus._M_p);
        }
        if (local_110 != &local_100) {
          operator_delete(local_110);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
          operator_delete(__str_2._M_dataplus._M_p);
        }
        if (local_88 != &local_78) {
          operator_delete(local_88);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
          operator_delete(__str_1._M_dataplus._M_p);
        }
        fputs(logfilename._M_dataplus._M_p,(FILE *)local_168->perfLogFP);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)logfilename._M_dataplus._M_p != &logfilename.field_2) {
          operator_delete(logfilename._M_dataplus._M_p);
        }
        uVar16 = uVar16 + 1;
      } while ((long)uVar16 < (long)totalRanks);
    }
    if (opentime_all_ranks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(opentime_all_ranks.super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

adiosStream::adiosStream(const std::string &streamName, adios2::IO &io, const adios2::Mode mode,
                         MPI_Comm comm, bool iotimer, size_t appid)
: Stream(streamName, mode), io(io), comm(comm)
{
    int myRank, totalRanks;
    MPI_Comm_rank(comm, &myRank);
    MPI_Comm_size(comm, &totalRanks);
    double timeStart, timeEnd;

    // double maxOpenTime, minOpenTime;
    hasIOTimer = iotimer;
    appID = appid;

    if (mode == adios2::Mode::Write)
    {
        timeStart = MPI_Wtime();
        engine = io.Open(streamName, adios2::Mode::Write, comm);
        timeEnd = MPI_Wtime();
    }
    else
    {
        timeStart = MPI_Wtime();
        engine = io.Open(streamName, adios2::Mode::Read, comm);
        timeEnd = MPI_Wtime();
    }
    if (hasIOTimer)
    {
        openTime = timeEnd - timeStart;
        std::vector<double> opentime_all_ranks;
        if (myRank == 0)
        {
            std::string logfilename = "app" + std::to_string(appID) + "_perf.csv";
            perfLogFP = fopen(logfilename.c_str(), "w");
            fputs("step,rank,operation,time\n", perfLogFP);
            std::cout << "performance log file open succeeded!" << std::endl;
            opentime_all_ranks.reserve(totalRanks);
        }
        MPI_Gather(&openTime, 1, MPI_DOUBLE, opentime_all_ranks.data(), 1, MPI_DOUBLE, 0, comm);
        if (myRank == 0)
        {
            for (int i = 0; i < totalRanks; i++)
            {
                std::string content = std::to_string(engine.CurrentStep()) + "," +
                                      std::to_string(i) + ",open," +
                                      std::to_string(opentime_all_ranks[i]) + "\n";
                // std::cout << content;
                fputs(content.c_str(), perfLogFP);
            }
        }
    }
    // openTime = timeEnd - timeStart;
    // MPI_Allreduce(&openTime, &maxOpenTime, 1, MPI_DOUBLE, MPI_MAX, comm);
    // MPI_Allreduce(&openTime, &minOpenTime, 1, MPI_DOUBLE, MPI_MIN, comm);
    // if (myRank == 0)
    // {
    //     std::cout << "        Max open time = " << maxOpenTime << std::endl;
    //     std::cout << "        Min open time = " << minOpenTime << std::endl;
    //     std::ofstream open_perf_log;
    //     open_perf_log.open("open_perf.txt", std::ios::app);
    //     open_perf_log << std::to_string(maxOpenTime) + ", " +
    //                          std::to_string(minOpenTime) + "\n";
    //     open_perf_log.close();
    // }
}